

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O1

CURLcode httpchunk_readwrite(Curl_easy *data,Curl_chunker *ch,Curl_cwriter *cw_next,char *buf,
                            size_t blen,size_t *pconsumed)

{
  dynbuf *s;
  byte bVar1;
  byte bVar2;
  curl_trc_feat *pcVar3;
  CURLcode CVar4;
  CURLcode CVar5;
  CURLofft CVar6;
  char *pcVar7;
  size_t sVar8;
  int iVar9;
  undefined8 uVar10;
  CURLcode CVar11;
  
  *pconsumed = 0;
  CVar11 = CURLE_OK;
  CVar5 = CURLE_OK;
  if (ch->state != CHUNK_DONE) {
    if (ch->state == CHUNK_FAILED) {
switchD_0013a74b_caseD_9:
      CVar5 = CURLE_RECV_ERROR;
    }
    else {
      if ((((data->set).field_0x8ce & 4) != 0) && ((ch->field_0x42 & 1) == 0)) {
        if (cw_next == (Curl_cwriter *)0x0) {
          CVar4 = Curl_client_write(data,1,buf,blen);
        }
        else {
          CVar4 = Curl_cwriter_write(data,cw_next,1,buf,blen);
        }
        if (CVar4 != CURLE_OK) {
LAB_0013a6fe:
          uVar10 = 0x600000009;
LAB_0013a708:
          ch->state = (int)uVar10;
          ch->last_code = (int)((ulong)uVar10 >> 0x20);
          return CVar4;
        }
      }
      if (blen != 0) {
        s = &ch->trailer;
        do {
          switch(ch->state) {
          case CHUNK_HEX:
            bVar2 = *buf;
            if (((byte)(bVar2 - 0x30) < 10) ||
               ((bVar2 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) != 0)
                ))) {
              bVar1 = ch->hexindex;
              if ((ulong)bVar1 < 0x10) {
                ch->hexindex = bVar1 + 1;
                ch->hexbuffer[bVar1] = bVar2;
                goto LAB_0013a9ca;
              }
              Curl_failf(data,"chunk hex-length longer than %d",0x10);
              uVar10 = 0x100000009;
            }
            else {
              if ((ulong)ch->hexindex == 0) {
                Curl_failf(data,"chunk hex-length char not a hex digit: 0x%x",
                           (ulong)(uint)(int)(char)bVar2);
              }
              else {
                ch->hexbuffer[ch->hexindex] = '\0';
                CVar6 = curlx_strtoofft(ch->hexbuffer,(char **)0x0,0x10,&ch->datasize);
                if (CVar6 == CURL_OFFT_OK) {
                  ch->state = CHUNK_LF;
                  break;
                }
                Curl_failf(data,"chunk hex-length not valid: \'%s\'",ch->hexbuffer);
              }
              uVar10 = 0x200000009;
            }
            goto LAB_0013abf1;
          case CHUNK_LF:
            if (*buf == 10) {
              if (ch->datasize == 0) {
                ch->state = CHUNK_TRAILER;
              }
              else {
                ch->state = CHUNK_DATA;
                if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                   (((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
                     (0 < pcVar3->log_level)) && (0 < Curl_trc_feat_write.log_level)))) {
                  Curl_trc_write(data,"http_chunked, chunk start of %ld bytes");
                }
              }
            }
            goto LAB_0013a9ca;
          case CHUNK_DATA:
            sVar8 = blen;
            if (ch->datasize < (long)blen) {
              sVar8 = curlx_sotouz(ch->datasize);
            }
            if (((*(ulong *)&(data->set).field_0x8ca & 0x400000000) == 0) &&
               ((ch->field_0x42 & 1) == 0)) {
              if (cw_next == (Curl_cwriter *)0x0) {
                CVar4 = Curl_client_write(data,1,buf,sVar8);
              }
              else {
                CVar4 = Curl_cwriter_write(data,cw_next,1,buf,sVar8);
              }
              if (CVar4 != CURLE_OK) goto LAB_0013a6fe;
            }
            *pconsumed = *pconsumed + sVar8;
            ch->datasize = ch->datasize - sVar8;
            if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar3->log_level)))) && (0 < Curl_trc_feat_write.log_level)) {
              Curl_trc_write(data,"http_chunked, write %zu body bytes, %ld bytes in chunk remain",
                             sVar8);
            }
            buf = (char *)((byte *)buf + sVar8);
            blen = blen - sVar8;
            if (ch->datasize == 0) {
              ch->state = CHUNK_POSTLF;
            }
            break;
          case CHUNK_POSTLF:
            if (*buf != 0xd) {
              if (*buf != 10) goto LAB_0013ab85;
              bVar2 = ch->field_0x42;
              ch->hexindex = '\0';
              ch->state = CHUNK_HEX;
              ch->last_code = CHUNKE_OK;
              Curl_dyn_reset(s);
              ch->field_0x42 = ch->field_0x42 & 0xfe | bVar2 & 1;
            }
            goto LAB_0013a9ca;
          case CHUNK_STOP:
            if (*buf != 10) {
              ch->state = CHUNK_FAILED;
              ch->last_code = CHUNKE_BAD_CHUNK;
              if (data == (Curl_easy *)0x0) {
                return CURLE_RECV_ERROR;
              }
              if (((data->set).field_0x8cd & 0x10) == 0) {
                return CURLE_RECV_ERROR;
              }
              pcVar3 = (data->state).feat;
              if ((pcVar3 != (curl_trc_feat *)0x0) && (pcVar3->log_level < 1)) {
                return CURLE_RECV_ERROR;
              }
              if (Curl_trc_feat_write.log_level < 1) {
                return CURLE_RECV_ERROR;
              }
              Curl_trc_write(data,"http_chunk error, expected 0x0a, seeing 0x%ux",
                             (ulong)(uint)(int)*buf);
              return CURLE_RECV_ERROR;
            }
            *pconsumed = *pconsumed + 1;
            ch->datasize = blen - 1;
            ch->state = CHUNK_DONE;
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
                (0 < pcVar3->log_level)))) {
              if (Curl_trc_feat_write.log_level < 1) {
                return CURLE_OK;
              }
              Curl_trc_write(data,"http_chunk, response complete");
              return CURLE_OK;
            }
            goto switchD_0013a74b_caseD_8;
          case CHUNK_TRAILER:
            if ((*buf == 0xd) || (*buf == 10)) {
              pcVar7 = Curl_dyn_ptr(s);
              if (pcVar7 == (char *)0x0) {
                ch->state = CHUNK_TRAILER_POSTCR;
                iVar9 = 4;
              }
              else {
                CVar5 = Curl_dyn_addn(s,"\r\n",2);
                if (CVar5 == CURLE_OK) {
                  pcVar7 = Curl_dyn_ptr(s);
                  sVar8 = Curl_dyn_len(s);
                  if ((*(ulong *)&(data->set).field_0x8ca & 0x400000000) == 0) {
                    if (cw_next == (Curl_cwriter *)0x0) {
                      CVar5 = Curl_client_write(data,0x44,pcVar7,sVar8);
                    }
                    else {
                      CVar5 = Curl_cwriter_write(data,cw_next,0x44,pcVar7,sVar8);
                    }
                    if (CVar5 != CURLE_OK) {
                      ch->state = CHUNK_FAILED;
                      ch->last_code = CHUNKE_PASSTHRU_ERROR;
                      iVar9 = 1;
                      CVar11 = CVar5;
                      goto LAB_0013a9ad;
                    }
                  }
                  Curl_dyn_reset(s);
                  ch->state = CHUNK_TRAILER_CR;
                  iVar9 = (uint)(*buf == 10) << 2;
                }
                else {
                  ch->state = CHUNK_FAILED;
                  ch->last_code = CHUNKE_OUT_OF_MEMORY;
                  iVar9 = 1;
                  CVar11 = CVar5;
                }
              }
LAB_0013a9ad:
              if (iVar9 != 0) {
                if (iVar9 != 4) {
                  return CVar11;
                }
                break;
              }
            }
            else {
              CVar4 = Curl_dyn_addn(s,buf,1);
              if (CVar4 != CURLE_OK) {
                uVar10 = 0x500000009;
                goto LAB_0013a708;
              }
            }
LAB_0013a9ca:
            buf = (char *)((byte *)buf + 1);
            blen = blen - 1;
            *pconsumed = *pconsumed + 1;
            break;
          case CHUNK_TRAILER_CR:
            if (*buf == 10) {
              ch->state = CHUNK_TRAILER_POSTCR;
              goto LAB_0013a9ca;
            }
LAB_0013ab85:
            uVar10 = 0x300000009;
LAB_0013abf1:
            ch->state = (int)uVar10;
            ch->last_code = (int)((ulong)uVar10 >> 0x20);
            goto switchD_0013a74b_caseD_9;
          case CHUNK_TRAILER_POSTCR:
            if (*buf != 10) {
              if (*buf != 0xd) {
                ch->state = CHUNK_TRAILER;
                break;
              }
              buf = (char *)((byte *)buf + 1);
              blen = blen - 1;
              *pconsumed = *pconsumed + 1;
            }
            ch->state = CHUNK_STOP;
            break;
          case CHUNK_DONE:
            goto switchD_0013a74b_caseD_8;
          case CHUNK_FAILED:
            goto switchD_0013a74b_caseD_9;
          }
        } while (blen != 0);
switchD_0013a74b_caseD_8:
        CVar5 = CURLE_OK;
      }
    }
  }
  return CVar5;
}

Assistant:

static CURLcode httpchunk_readwrite(struct Curl_easy *data,
                                    struct Curl_chunker *ch,
                                    struct Curl_cwriter *cw_next,
                                    const char *buf, size_t blen,
                                    size_t *pconsumed)
{
  CURLcode result = CURLE_OK;
  size_t piece;

  *pconsumed = 0; /* nothing's written yet */
  /* first check terminal states that will not progress anywhere */
  if(ch->state == CHUNK_DONE)
    return CURLE_OK;
  if(ch->state == CHUNK_FAILED)
    return CURLE_RECV_ERROR;

  /* the original data is written to the client, but we go on with the
     chunk read process, to properly calculate the content length */
  if(data->set.http_te_skip && !ch->ignore_body) {
    if(cw_next)
      result = Curl_cwriter_write(data, cw_next, CLIENTWRITE_BODY, buf, blen);
    else
      result = Curl_client_write(data, CLIENTWRITE_BODY, (char *)buf, blen);
    if(result) {
      ch->state = CHUNK_FAILED;
      ch->last_code = CHUNKE_PASSTHRU_ERROR;
      return result;
    }
  }

  while(blen) {
    switch(ch->state) {
    case CHUNK_HEX:
      if(ISXDIGIT(*buf)) {
        if(ch->hexindex >= CHUNK_MAXNUM_LEN) {
          failf(data, "chunk hex-length longer than %d", CHUNK_MAXNUM_LEN);
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_TOO_LONG_HEX; /* longer than we support */
          return CURLE_RECV_ERROR;
        }
        ch->hexbuffer[ch->hexindex++] = *buf;
        buf++;
        blen--;
        (*pconsumed)++;
      }
      else {
        if(0 == ch->hexindex) {
          /* This is illegal data, we received junk where we expected
             a hexadecimal digit. */
          failf(data, "chunk hex-length char not a hex digit: 0x%x", *buf);
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_ILLEGAL_HEX;
          return CURLE_RECV_ERROR;
        }

        /* blen and buf are unmodified */
        ch->hexbuffer[ch->hexindex] = 0;
        if(curlx_strtoofft(ch->hexbuffer, NULL, 16, &ch->datasize)) {
          failf(data, "chunk hex-length not valid: '%s'", ch->hexbuffer);
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_ILLEGAL_HEX;
          return CURLE_RECV_ERROR;
        }
        ch->state = CHUNK_LF; /* now wait for the CRLF */
      }
      break;

    case CHUNK_LF:
      /* waiting for the LF after a chunk size */
      if(*buf == 0x0a) {
        /* we are now expecting data to come, unless size was zero! */
        if(0 == ch->datasize) {
          ch->state = CHUNK_TRAILER; /* now check for trailers */
        }
        else {
          ch->state = CHUNK_DATA;
          CURL_TRC_WRITE(data, "http_chunked, chunk start of %"
                         FMT_OFF_T " bytes", ch->datasize);
        }
      }

      buf++;
      blen--;
      (*pconsumed)++;
      break;

    case CHUNK_DATA:
      /* We expect 'datasize' of data. We have 'blen' right now, it can be
         more or less than 'datasize'. Get the smallest piece.
      */
      piece = blen;
      if(ch->datasize < (curl_off_t)blen)
        piece = curlx_sotouz(ch->datasize);

      /* Write the data portion available */
      if(!data->set.http_te_skip && !ch->ignore_body) {
        if(cw_next)
          result = Curl_cwriter_write(data, cw_next, CLIENTWRITE_BODY,
                                      buf, piece);
        else
          result = Curl_client_write(data, CLIENTWRITE_BODY,
                                    (char *)buf, piece);
        if(result) {
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_PASSTHRU_ERROR;
          return result;
        }
      }

      *pconsumed += piece;
      ch->datasize -= piece; /* decrease amount left to expect */
      buf += piece;    /* move read pointer forward */
      blen -= piece;   /* decrease space left in this round */
      CURL_TRC_WRITE(data, "http_chunked, write %zu body bytes, %"
                     FMT_OFF_T " bytes in chunk remain",
                     piece, ch->datasize);

      if(0 == ch->datasize)
        /* end of data this round, we now expect a trailing CRLF */
        ch->state = CHUNK_POSTLF;
      break;

    case CHUNK_POSTLF:
      if(*buf == 0x0a) {
        /* The last one before we go back to hex state and start all over. */
        Curl_httpchunk_reset(data, ch, ch->ignore_body);
      }
      else if(*buf != 0x0d) {
        ch->state = CHUNK_FAILED;
        ch->last_code = CHUNKE_BAD_CHUNK;
        return CURLE_RECV_ERROR;
      }
      buf++;
      blen--;
      (*pconsumed)++;
      break;

    case CHUNK_TRAILER:
      if((*buf == 0x0d) || (*buf == 0x0a)) {
        char *tr = Curl_dyn_ptr(&ch->trailer);
        /* this is the end of a trailer, but if the trailer was zero bytes
           there was no trailer and we move on */

        if(tr) {
          size_t trlen;
          result = Curl_dyn_addn(&ch->trailer, (char *)STRCONST("\x0d\x0a"));
          if(result) {
            ch->state = CHUNK_FAILED;
            ch->last_code = CHUNKE_OUT_OF_MEMORY;
            return result;
          }
          tr = Curl_dyn_ptr(&ch->trailer);
          trlen = Curl_dyn_len(&ch->trailer);
          if(!data->set.http_te_skip) {
            if(cw_next)
              result = Curl_cwriter_write(data, cw_next,
                                          CLIENTWRITE_HEADER|
                                          CLIENTWRITE_TRAILER,
                                          tr, trlen);
            else
              result = Curl_client_write(data,
                                         CLIENTWRITE_HEADER|
                                         CLIENTWRITE_TRAILER,
                                         tr, trlen);
            if(result) {
              ch->state = CHUNK_FAILED;
              ch->last_code = CHUNKE_PASSTHRU_ERROR;
              return result;
            }
          }
          Curl_dyn_reset(&ch->trailer);
          ch->state = CHUNK_TRAILER_CR;
          if(*buf == 0x0a)
            /* already on the LF */
            break;
        }
        else {
          /* no trailer, we are on the final CRLF pair */
          ch->state = CHUNK_TRAILER_POSTCR;
          break; /* do not advance the pointer */
        }
      }
      else {
        result = Curl_dyn_addn(&ch->trailer, buf, 1);
        if(result) {
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_OUT_OF_MEMORY;
          return result;
        }
      }
      buf++;
      blen--;
      (*pconsumed)++;
      break;

    case CHUNK_TRAILER_CR:
      if(*buf == 0x0a) {
        ch->state = CHUNK_TRAILER_POSTCR;
        buf++;
        blen--;
        (*pconsumed)++;
      }
      else {
        ch->state = CHUNK_FAILED;
        ch->last_code = CHUNKE_BAD_CHUNK;
        return CURLE_RECV_ERROR;
      }
      break;

    case CHUNK_TRAILER_POSTCR:
      /* We enter this state when a CR should arrive so we expect to
         have to first pass a CR before we wait for LF */
      if((*buf != 0x0d) && (*buf != 0x0a)) {
        /* not a CR then it must be another header in the trailer */
        ch->state = CHUNK_TRAILER;
        break;
      }
      if(*buf == 0x0d) {
        /* skip if CR */
        buf++;
        blen--;
        (*pconsumed)++;
      }
      /* now wait for the final LF */
      ch->state = CHUNK_STOP;
      break;

    case CHUNK_STOP:
      if(*buf == 0x0a) {
        blen--;
        (*pconsumed)++;
        /* Record the length of any data left in the end of the buffer
           even if there is no more chunks to read */
        ch->datasize = blen;
        ch->state = CHUNK_DONE;
        CURL_TRC_WRITE(data, "http_chunk, response complete");
        return CURLE_OK;
      }
      else {
        ch->state = CHUNK_FAILED;
        ch->last_code = CHUNKE_BAD_CHUNK;
        CURL_TRC_WRITE(data, "http_chunk error, expected 0x0a, seeing 0x%ux",
                       (unsigned int)*buf);
        return CURLE_RECV_ERROR;
      }
    case CHUNK_DONE:
      return CURLE_OK;

    case CHUNK_FAILED:
      return CURLE_RECV_ERROR;
    }

  }
  return CURLE_OK;
}